

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O1

ztlex_t * ztlex_from_file(ztlex_mallocfn_t *mallocfn,ztlex_freefn_t *freefn,char *filename)

{
  ztlex_t *pzVar1;
  FILE *pFVar2;
  
  pzVar1 = (ztlex_t *)(*mallocfn)(0x360);
  if (pzVar1 != (ztlex_t *)0x0) {
    pFVar2 = fopen(filename,"r");
    pzVar1->file = (FILE *)pFVar2;
    if (pFVar2 != (FILE *)0x0) {
      pzVar1->ungottenptr = pzVar1->ungotten;
      pzVar1->string = (char *)0x0;
      pzVar1->length = 0;
      pzVar1->index = 0;
      pzVar1->line = 1;
      pzVar1->column = 1;
      pzVar1->prevcolumn = -1;
      pzVar1->getC = ztlex_fgetc;
      pzVar1->ungetC = ztlex_fungetc;
      pzVar1->freefn = freefn;
      return pzVar1;
    }
    (*freefn)(pzVar1);
  }
  return (ztlex_t *)0x0;
}

Assistant:

ztlex_t *ztlex_from_file(ztlex_mallocfn_t *mallocfn,
                         ztlex_freefn_t   *freefn,
                         const char       *filename)
{
  ztlex_t *lex = NULL;

  lex = mallocfn(sizeof(*lex));
  if (lex == NULL)
    return NULL;

  lex->file = fopen(filename, "r");
  if (lex->file == NULL)
  {
    freefn(lex);
    return NULL;
  }

  lex->ungottenptr = &lex->ungotten[0];

  lex->string      = NULL;
  lex->length      = 0;
  lex->index       = 0;

  lex->line        = 1;
  lex->column      = 1;
  lex->prevcolumn  = -1;

  lex->getC        = ztlex_fgetc;
  lex->ungetC      = ztlex_fungetc;

  lex->freefn      = freefn;

  return lex;
}